

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4f39de::Db::parseSourceName(Db *this,NameState *param_1)

{
  bool bVar1;
  Node *pNVar2;
  NameType *pNVar3;
  StringView Str;
  size_t Length;
  StringView Name;
  
  Length = 0;
  bVar1 = parsePositiveInteger(this,&Length);
  if ((!bVar1) &&
     (Name.First = this->First, Length - 1 < (ulong)((long)this->Last - (long)Name.First))) {
    Name.Last = Name.First + Length;
    this->First = Name.Last;
    Str.Last = "";
    Str.First = "_GLOBAL__N";
    bVar1 = StringView::startsWith(&Name,Str);
    if (bVar1) {
      pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar2->K = KNameType;
      pNVar2->RHSComponentCache = No;
      pNVar2->ArrayCache = No;
      pNVar2->FunctionCache = No;
      pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002416d0;
      pNVar2[1]._vptr_Node = (_func_int **)"(anonymous namespace)";
      *(char **)&pNVar2[1].K = "";
      return pNVar2;
    }
    pNVar3 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,StringView&>
                       ((Db *)this,&Name);
    return &pNVar3->super_Node;
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseSourceName(NameState *) {
  size_t Length = 0;
  if (parsePositiveInteger(&Length))
    return nullptr;
  if (numLeft() < Length || Length == 0)
    return nullptr;
  StringView Name(First, First + Length);
  First += Length;
  if (Name.startsWith("_GLOBAL__N"))
    return make<NameType>("(anonymous namespace)");
  return make<NameType>(Name);
}